

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O0

double __thiscall
lineage::heuristics::PartitionGraph::move(PartitionGraph *this,size_t v,size_t targetPartition)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  ostream *poVar5;
  void *pvVar6;
  runtime_error *prVar7;
  reference pvVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  size_t sVar12;
  pointer pAVar13;
  size_t sVar14;
  Value VVar15;
  reference pvVar16;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar17;
  vector<double,_std::allocator<double>_> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  reference rVar18;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar19;
  pair<bool,_unsigned_long> pVar20;
  pair<bool,_unsigned_long> p_1;
  pair<bool,_unsigned_long> p;
  size_t newBranchingEdge;
  size_t previousBranchingEdge;
  AdjacencyIterator it_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  double objectiveChange;
  unsigned_long *w_1;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  AdjacencyIterator it_1;
  value_type w;
  vector<bool,_std::allocator<bool>_> visited;
  const_iterator it;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> stack;
  size_t previousPartition;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffffcb8;
  PartitionGraph *in_stack_fffffffffffffcc0;
  value_type *in_stack_fffffffffffffcc8;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffcd0;
  size_type in_stack_fffffffffffffcd8;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffce0;
  size_t in_stack_fffffffffffffce8;
  PartitionGraph *in_stack_fffffffffffffcf0;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffffcf8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd20;
  PartitionGraph *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  undefined8 in_stack_fffffffffffffd50;
  undefined1 __x;
  size_type in_stack_fffffffffffffd58;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffd60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd88;
  PartitionGraph *in_stack_fffffffffffffd90;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_188;
  PartitionGraph *local_180;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_170 [4];
  double local_150;
  _Node_iterator_base<unsigned_long,_false> local_148;
  undefined1 local_140;
  int local_134;
  reference local_130;
  reference local_120;
  _Node_iterator_base<unsigned_long,_false> local_118;
  _Node_iterator_base<unsigned_long,_false> local_110;
  reference local_108;
  Value local_100;
  reference local_f8;
  Adjacency<unsigned_long> *local_e8;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_e0;
  reference local_d8;
  value_type local_c8;
  _Node_iterator_base<unsigned_long,_false> local_98;
  _Node_iterator_base<unsigned_long,_false> local_90 [11];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  ulong local_20;
  size_type local_18;
  double local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98));
  if (sVar4 <= in_RSI) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Node: ");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,local_18);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Failed to move. Node doesnt exist!");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98),
                      local_18);
  local_38 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar8;
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                *)(in_RDI + 0x80),(size_type)local_38);
  sVar9 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)0x1de893);
  if (2 < sVar9) {
    std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
    stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
              ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               in_stack_fffffffffffffcc0);
    std::
    vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0x80),(size_type)local_38);
    local_90[0]._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::cbegin((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)in_stack_fffffffffffffcb8);
    while( true ) {
      std::
      vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 0x80),(size_type)local_38);
      local_98._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::cend((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)in_stack_fffffffffffffcb8);
      bVar3 = std::__detail::operator!=(local_90,&local_98);
      __x = (undefined1)((ulong)in_stack_fffffffffffffd50 >> 0x38);
      if (!bVar3) break;
      pvVar10 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*
                          ((_Node_const_iterator<unsigned_long,_true,_false> *)0x1de92a);
      __x = (undefined1)((ulong)in_stack_fffffffffffffd50 >> 0x38);
      if (*pvVar10 != local_18) {
        std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*
                  ((_Node_const_iterator<unsigned_long,_true,_false> *)0x1de944);
        std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                  ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
        break;
      }
      std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++
                ((_Node_const_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffffcc0);
    }
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x1de99a);
    ProblemGraph::graph((ProblemGraph *)**(undefined8 **)(in_RDI + 0x78));
    andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
              ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1de9b6);
    std::vector<bool,_std::allocator<bool>_>::resize
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,(bool)__x);
    while( true ) {
      bVar3 = std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::empty((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                       *)0x1de9d9);
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      pvVar11 = std::
                stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                top((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                     *)0x1de9f9);
      local_c8 = *pvVar11;
      std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )0x1dea11);
      rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffce0,
                          in_stack_fffffffffffffcd8);
      local_d8 = rVar18;
      std::_Bit_reference::operator=(&local_d8,true);
      ProblemGraph::graph((ProblemGraph *)**(undefined8 **)(in_RDI + 0x78));
      local_e0._M_current =
           (Adjacency<unsigned_long> *)
           andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
           adjacenciesFromVertexBegin(in_stack_fffffffffffffcb8,0x1dea8e);
      while( true ) {
        ProblemGraph::graph((ProblemGraph *)**(undefined8 **)(in_RDI + 0x78));
        local_e8 = (Adjacency<unsigned_long> *)
                   andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                   adjacenciesFromVertexEnd(in_stack_fffffffffffffcb8,0x1deaba);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffcc0,
                           (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffcb8);
        if (!bVar3) break;
        pAVar13 = __gnu_cxx::
                  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                  ::operator->(&local_e0);
        VVar15 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
        if (VVar15 != local_18) {
          pAVar13 = __gnu_cxx::
                    __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                    ::operator->(&local_e0);
          andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
          rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffce0,
                              in_stack_fffffffffffffcd8);
          local_f8 = rVar18;
          bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_f8);
          if (!bVar3) {
            pAVar13 = __gnu_cxx::
                      __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                      ::operator->(&local_e0);
            VVar15 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
            pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (in_RDI + 0x98),VVar15);
            if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar8 == local_38) {
              pAVar13 = __gnu_cxx::
                        __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                        ::operator->(&local_e0);
              local_100 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
              std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::push((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
        ::operator++(&local_e0);
      }
    }
    local_108 = std::
                vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                              *)(in_RDI + 0x80),(size_type)local_38);
    local_110._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::begin((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)in_stack_fffffffffffffcb8);
    local_118._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::end((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)in_stack_fffffffffffffcb8);
    while( true ) {
      bVar3 = std::__detail::operator!=(&local_110,&local_118);
      if (!bVar3) break;
      local_120 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                            ((_Node_iterator<unsigned_long,_true,_false> *)0x1deca9);
      if (*local_120 != local_18) {
        rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffce0,
                            in_stack_fffffffffffffcd8);
        local_130 = rVar18;
        bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_130);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          local_8 = std::numeric_limits<double>::infinity();
          local_134 = 1;
          goto LAB_001ded61;
        }
      }
      std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffffcc0);
    }
    local_134 = 0;
LAB_001ded61:
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x1ded6e);
    std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~stack
              ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               0x1ded7b);
    if (local_134 != 0) {
      return local_8;
    }
  }
  uVar2 = local_20;
  sVar4 = std::
          vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ::size((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0x80));
  if (sVar4 <= uVar2) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Partition does not exist!");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                *)(in_RDI + 0x80),(size_type)local_38);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::erase((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *)in_stack_fffffffffffffcc0,(key_type *)in_stack_fffffffffffffcb8);
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                *)(in_RDI + 0x80),local_20);
  pVar19 = std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::insert(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  uVar2 = local_20;
  local_148._M_cur =
       (__node_type *)pVar19.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
  local_140 = pVar19.second;
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98),
                      local_18);
  *pvVar8 = uVar2;
  local_150 = 0.0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1deef3);
  ProblemGraph::graph((ProblemGraph *)**(undefined8 **)(in_RDI + 0x78));
  local_170[0]._M_current =
       (Adjacency<unsigned_long> *)
       andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
       adjacenciesFromVertexBegin(in_stack_fffffffffffffcb8,0x1def17);
  local_180 = in_stack_fffffffffffffcc0;
  local_188 = in_stack_fffffffffffffcd0;
  do {
    ProblemGraph::graph((ProblemGraph *)**(undefined8 **)(in_RDI + 0x78));
    andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::adjacenciesFromVertexEnd
              (in_stack_fffffffffffffcb8,0x1def43);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                        *)local_180,
                       (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                        *)in_stack_fffffffffffffcb8);
    if (!bVar3) {
      removeVanishedEdges<std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      local_8 = local_150;
      local_134 = 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188);
      return local_8;
    }
    sVar12 = ProblemGraph::frameOfNode((ProblemGraph *)local_180,(size_t)in_stack_fffffffffffffcb8);
    pAVar13 = __gnu_cxx::
              __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
              ::operator->(local_170);
    andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
    sVar14 = ProblemGraph::frameOfNode((ProblemGraph *)local_180,(size_t)in_stack_fffffffffffffcb8);
    if (sVar12 == sVar14) {
      pAVar13 = __gnu_cxx::
                __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                ::operator->(local_170);
      VVar15 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98),
                          VVar15);
      if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar8 == local_38) {
        lVar1 = *(long *)(in_RDI + 0x78);
        pAVar13 = __gnu_cxx::
                  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                  ::operator->(local_170);
        VVar15 = andres::graph::Adjacency<unsigned_long>::edge(pAVar13);
        pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x20),VVar15);
        local_150 = *pvVar16 + local_150;
      }
      else {
        pAVar13 = __gnu_cxx::
                  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                  ::operator->(local_170);
        VVar15 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98)
                            ,VVar15);
        if (*pvVar8 == local_20) {
          lVar1 = *(long *)(in_RDI + 0x78);
          pAVar13 = __gnu_cxx::
                    __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                    ::operator->(local_170);
          VVar15 = andres::graph::Adjacency<unsigned_long>::edge(pAVar13);
          pvVar16 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x20),VVar15);
          local_150 = local_150 - *pvVar16;
        }
      }
    }
    else {
      sVar12 = ProblemGraph::frameOfNode
                         ((ProblemGraph *)local_180,(size_t)in_stack_fffffffffffffcb8);
      pAVar13 = __gnu_cxx::
                __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                ::operator->(local_170);
      andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
      sVar14 = ProblemGraph::frameOfNode
                         ((ProblemGraph *)local_180,(size_t)in_stack_fffffffffffffcb8);
      if (sVar12 < sVar14) {
        in_stack_fffffffffffffd88 = local_38;
        pAVar13 = __gnu_cxx::
                  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                  ::operator->(local_170);
        VVar15 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98),VVar15);
        pVar20 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                           ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                            CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                            (size_t)in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20);
        local_180 = (PartitionGraph *)pVar20.second;
        if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"v=");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)local_38);
          poVar5 = std::operator<<(poVar5," w=");
          pvVar17 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98);
          pAVar13 = __gnu_cxx::
                    __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                    ::operator->(local_170);
          VVar15 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar17,VVar15);
          pvVar6 = (void *)std::ostream::operator<<(poVar5,*pvVar8);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"Inconsistent edges!");
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        in_stack_fffffffffffffd90 = local_180;
        pAVar13 = __gnu_cxx::
                  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                  ::operator->(local_170);
        VVar15 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98),VVar15);
        local_188 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                       insertEdge(in_stack_fffffffffffffcf8,(size_t)in_stack_fffffffffffffcf0,
                                  in_stack_fffffffffffffce8);
      }
      else {
        in_stack_fffffffffffffd20 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98);
        pAVar13 = __gnu_cxx::
                  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                  ::operator->(local_170);
        VVar15 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (in_stack_fffffffffffffd20,VVar15);
        pVar20 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                           ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                            CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                            (size_t)in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20);
        local_180 = (PartitionGraph *)pVar20.second;
        in_stack_fffffffffffffd37 = pVar20.first;
        if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Error log: edge with v=");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)local_38);
          poVar5 = std::operator<<(poVar5,", w=");
          pvVar17 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98);
          pAVar13 = __gnu_cxx::
                    __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                    ::operator->(local_170);
          VVar15 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (pvVar17,VVar15);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar8);
          poVar5 = std::operator<<(poVar5,"not found!");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"Inconsistent edges!");
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pvVar17 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x98);
        in_stack_fffffffffffffd28 = local_180;
        pAVar13 = __gnu_cxx::
                  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                  ::operator->(local_170);
        VVar15 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar13);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar17,VVar15);
        in_stack_fffffffffffffce0 =
             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertEdge
                          (in_stack_fffffffffffffcf8,(size_t)in_stack_fffffffffffffcf0,
                           in_stack_fffffffffffffce8);
        local_188 = in_stack_fffffffffffffce0;
      }
      this_00 = (vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x78) + 0x20);
      pAVar13 = __gnu_cxx::
                __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                ::operator->(local_170);
      VVar15 = andres::graph::Adjacency<unsigned_long>::edge(pAVar13);
      std::vector<double,_std::allocator<double>_>::operator[](this_00,VVar15);
      updateEdgeCost(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                     (double)in_stack_fffffffffffffce0);
      in_stack_fffffffffffffcb8 =
           (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
           (*(long *)(in_RDI + 0x78) + 0x20);
      pAVar13 = __gnu_cxx::
                __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                ::operator->(local_170);
      VVar15 = andres::graph::Adjacency<unsigned_long>::edge(pAVar13);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcb8,VVar15);
      updateEdgeCost(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                     (double)in_stack_fffffffffffffce0);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188,
                 (unsigned_long *)this_00);
    }
    __gnu_cxx::
    __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
    ::operator++(local_170);
  } while( true );
}

Assistant:

double move(const size_t v, const size_t targetPartition)
    {
        if (v >= vertexLabels_.size()) {
            std::cerr << "Node: " << v << std::endl;
            throw std::runtime_error("Failed to move. Node doesnt exist!");
        }
        const size_t previousPartition = vertexLabels_[v];

        // make sure moving the node doesnt split the partition.
        if (partitions_[previousPartition].size() > 2) {

            std::stack<size_t> stack;

            for (auto it = partitions_[previousPartition].cbegin();
                 it != partitions_[previousPartition].cend(); ++it) {
                if (*it != v) {
                    stack.push(*it);
                    break;
                }
            }

            std::vector<bool> visited;
            visited.resize(this->data_.problemGraph.graph().numberOfVertices(),
                           false);

            while (!stack.empty()) {
                const auto w = stack.top();
                stack.pop();

                visited[w] = true;

                for (auto it = this->data_.problemGraph.graph()
                                   .adjacenciesFromVertexBegin(w);
                     it !=
                     this->data_.problemGraph.graph().adjacenciesFromVertexEnd(
                         w);
                     ++it) {
                    if (it->vertex() == v)
                        continue;
                    if (visited[it->vertex()])
                        continue;
                    if (vertexLabels_[it->vertex()] == previousPartition)
                        stack.push(it->vertex());
                }
            }

            for (const auto& w : partitions_[previousPartition]) {
                if (w == v) {
                    continue;
                }

                // if it would break a partition, then dont move.
                if (!visited[w]) {
                    return std::numeric_limits<double>::infinity();
                }
            }
        }

        if (targetPartition >= partitions_.size())
            throw std::runtime_error("Partition does not exist!");

        // move the node v to the same partition w.
        partitions_[previousPartition].erase(v);
        partitions_[targetPartition].insert(v);
        vertexLabels_[v] = targetPartition;

        // calculate objective change in-plane and update costs for
        // the branching.
        auto objectiveChange = .0;
        std::vector<size_t> buffer;
        for (auto it =
                 this->data_.problemGraph.graph().adjacenciesFromVertexBegin(v);
             it != this->data_.problemGraph.graph().adjacenciesFromVertexEnd(v);
             ++it) {

            // in-frame.
            if (this->data_.problemGraph.frameOfNode(v) ==
                this->data_.problemGraph.frameOfNode(it->vertex())) {

                // (v, it->vertex) becomes a cut edge.
                if (vertexLabels_[it->vertex()] == previousPartition) {
                    objectiveChange += this->data_.costs[it->edge()];

                    // (v, it->vertex) becomes an internal edge.
                } else if (vertexLabels_[it->vertex()] == targetPartition) {
                    objectiveChange -= this->data_.costs[it->edge()];
                }

            } else { // inter-frame.
                size_t previousBranchingEdge, newBranchingEdge;

                if (this->data_.problemGraph.frameOfNode(v) <
                    this->data_.problemGraph.frameOfNode(it->vertex())) {

                    const auto p = this->findEdge(previousPartition,
                                                  vertexLabels_[it->vertex()]);
                    if (!p.first) {
                        std::cerr << "v=" << previousPartition
                                  << " w=" << vertexLabels_[it->vertex()]
                                  << std::endl;
                        throw std::runtime_error("Inconsistent edges!");
                    }
                    previousBranchingEdge = p.second;
                    newBranchingEdge = this->insertEdge(
                        targetPartition, vertexLabels_[it->vertex()]);
                } else {
                    const auto p = this->findEdge(vertexLabels_[it->vertex()],
                                                  previousPartition);
                    if (!p.first) {
                        std::cerr
                            << "Error log: edge with v=" << previousPartition
                            << ", w=" << vertexLabels_[it->vertex()]
                            << "not found!" << std::endl;
                        throw std::runtime_error("Inconsistent edges!");
                    }
                    previousBranchingEdge = p.second;
                    newBranchingEdge = this->insertEdge(
                        vertexLabels_[it->vertex()], targetPartition);
                }

                updateEdgeCost(newBranchingEdge,
                               -this->data_.costs[it->edge()]);
                updateEdgeCost(previousBranchingEdge,
                               this->data_.costs[it->edge()]);

                // we will only need to check branching edges where the
                // contributing edge of v was removed whether they vanished.
                buffer.emplace_back(previousBranchingEdge);
            }
        }

        // check if we have to remove edges.
        removeVanishedEdges(buffer);

        return objectiveChange;
    }